

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O0

void cppcms::impl::details::decimal_traits<true>::conv<short>(short v,char **begin,char **buf)

{
  char *pcVar1;
  char **in_RDX;
  char **in_RSI;
  short in_DI;
  short local_2;
  
  if (in_DI < 0) {
    pcVar1 = *in_RDX;
    *in_RDX = pcVar1 + 1;
    *pcVar1 = '-';
    *in_RSI = *in_RDX;
    for (local_2 = in_DI; local_2 != 0; local_2 = local_2 / 10) {
      pcVar1 = *in_RDX;
      *in_RDX = pcVar1 + 1;
      *pcVar1 = '0' - (char)((int)local_2 % 10);
    }
  }
  else {
    decimal_traits<false>::conv<short>(in_DI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

static void conv(T v,char *&begin,char *&buf)
				{
					if(v<0) {
						*buf++ = '-';
						begin=buf;
						while(v!=0) {
							*buf++ = '0' - (v % 10);
							v/=10;
						}
					}
					else {
						decimal_traits<false>::conv(v,begin,buf);
					}
				}